

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O1

void __thiscall asl::XdlEncoder::_encode(XdlEncoder *this,Var *v)

{
  int *piVar1;
  Type TVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Var *pVVar7;
  char *_class;
  Var *pVVar8;
  Var *pVVar9;
  int *piVar10;
  String *pSVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar12;
  undefined7 uVar13;
  undefined8 extraout_RDX_01;
  char b;
  anon_union_8_8_7df20137_for_Var_3 x;
  anon_union_16_2_78e7fdac_for_String_2 *paVar14;
  anon_union_16_2_78e7fdac_for_String_2 *paVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  String s;
  undefined1 local_a0 [24];
  int local_88;
  int local_80;
  undefined8 local_78;
  anon_union_16_2_78e7fdac_for_String_2 *local_70;
  int *local_68;
  anon_union_16_2_78e7fdac_for_String_2 *local_60;
  String *local_58;
  anon_union_16_2_78e7fdac_for_String_2 *local_50;
  String local_48;
  
  switch(v->_type) {
  case NONE:
  case NUL:
    String::append(&this->_out,"null",4);
    break;
  case NUMBER:
    new_number(this,(v->field_1)._d);
    break;
  case BOOL:
    new_bool(this,(v->field_1)._b);
    break;
  case INT:
    new_number(this,(v->field_1)._i);
    break;
  case SSTRING:
    x._l = (Long)&v->field_1;
    goto LAB_0012c866;
  case FLOAT:
    new_number(this,(float)(v->field_1)._d);
    break;
  case STRING:
    x = v->field_1;
LAB_0012c866:
    new_string(this,(char *)x);
    break;
  case ARRAY:
    String::operator+=(&this->_out,'[');
    iVar18 = Var::length(v);
    uVar12 = extraout_RDX;
    pVVar7 = v;
    if (0 < iVar18) {
      pVVar7 = Var::operator[](v,0);
      uVar12 = extraout_RDX_00;
    }
    if (this->_pretty == true) {
      uVar13 = (undefined7)((ulong)uVar12 >> 8);
      uVar17 = CONCAT71(uVar13,10 < iVar18);
      if (0xfffffff5 < iVar18 - 0xbU) {
        uVar17 = CONCAT71(uVar13,pVVar7->_type - ARRAY < 2);
      }
    }
    else {
      uVar17 = 0;
    }
    if ((this->_pretty == true && (char)uVar17 == '\0') &&
       (((pVVar7->_type == STRING || (pVVar7->_type == SSTRING)) && (0 < iVar18)))) {
      local_70 = (anon_union_16_2_78e7fdac_for_String_2 *)CONCAT44(local_70._4_4_,(int)uVar17);
      iVar6 = 0;
      iVar4 = 0;
      do {
        pVVar9 = Var::operator[](v,iVar6);
        iVar5 = Var::length(pVVar9);
        iVar4 = iVar5 + iVar4;
        if (100 < iVar4) {
          uVar17 = CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),1);
          goto LAB_0012ccbd;
        }
        iVar6 = iVar6 + 1;
      } while (iVar18 != iVar6);
      uVar17 = (ulong)local_70 & 0xffffffff;
    }
LAB_0012ccbd:
    local_70 = (anon_union_16_2_78e7fdac_for_String_2 *)CONCAT44(local_70._4_4_,(int)uVar17);
    if ((char)uVar17 == '\0') {
      local_78 = (Var *)((ulong)local_78._4_4_ << 0x20);
    }
    else {
      if (iVar18 < 1) {
        local_78 = (Var *)((ulong)local_78._4_4_ << 0x20);
      }
      else {
        TVar2 = pVVar7->_type;
        local_78 = (Var *)CONCAT44(local_78._4_4_,(int)CONCAT71((int7)(uVar17 >> 8),1));
        if (1 < TVar2 - ARRAY) {
          local_78 = (Var *)CONCAT44(local_78._4_4_,
                                     CONCAT31((int3)(TVar2 >> 8),TVar2 == SSTRING || TVar2 == STRING
                                             ));
        }
      }
      uVar16 = this->_level + 1;
      this->_level = uVar16;
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      uVar17 = (ulong)uVar16;
      String::alloc((String *)local_a0,uVar16);
      pVVar7 = (Var *)(local_a0 + 8);
      pVVar9 = pVVar7;
      if (local_a0._0_4_ != 0) {
        pVVar9 = (Var *)local_a0._8_8_;
      }
      *(undefined1 *)((long)&pVVar9->_type + uVar17) = 0;
      pVVar9 = pVVar7;
      if (local_a0._0_4_ != 0) {
        pVVar9 = (Var *)local_a0._8_8_;
      }
      local_a0._4_4_ = uVar16;
      memset(pVVar9,9,uVar17);
      *(undefined1 *)((long)&pVVar9->_type + uVar17) = 0;
      if (local_a0._0_4_ != 0) {
        pVVar7 = (Var *)local_a0._8_8_;
      }
      String::assign(&this->_indent,(char *)pVVar7,local_a0._4_4_);
      if (local_a0._0_4_ != 0) {
        free((void *)local_a0._8_8_);
      }
      String::operator+=(&this->_out,'\n');
      if ((this->_indent)._size == 0) {
        paVar14 = &(this->_indent).field_2;
      }
      else {
        paVar14 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_indent).field_2._str;
      }
      String::append(&this->_out,paVar14->_space,(this->_indent)._len);
    }
    iVar18 = Var::length(v);
    if (0 < iVar18) {
      paVar14 = &(this->_sep1).field_2;
      piVar1 = &(this->_sep1)._len;
      local_50 = &(this->_sep2).field_2;
      local_58 = &this->_indent;
      local_60 = &(this->_indent).field_2;
      local_68 = &(this->_indent)._len;
      uVar16 = 0;
      local_78 = (Var *)CONCAT44(local_78._4_4_,
                                 CONCAT31((int3)((ulong)local_78 >> 8),~(byte)local_78));
      do {
        if (uVar16 != 0) {
          piVar10 = piVar1;
          pSVar11 = &this->_sep1;
          paVar15 = paVar14;
          if (((char)local_70 != '\0') && (((byte)local_78 & (uVar16 & 0xf) != 0) == 0)) {
            paVar15 = local_50;
            if ((this->_sep2)._size != 0) {
              paVar15 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_sep2).field_2._str;
            }
            String::append(&this->_out,paVar15->_space,(this->_sep2)._len);
            String::operator+=(&this->_out,'\n');
            piVar10 = local_68;
            pSVar11 = local_58;
            paVar15 = local_60;
          }
          if (pSVar11->_size != 0) {
            paVar15 = (anon_union_16_2_78e7fdac_for_String_2 *)paVar15->_str;
          }
          String::append(&this->_out,paVar15->_space,*piVar10);
        }
        pVVar7 = Var::operator[](v,uVar16);
        _encode(this,pVVar7);
        uVar16 = uVar16 + 1;
        iVar18 = Var::length(v);
      } while ((int)uVar16 < iVar18);
    }
    if ((char)local_70 != '\0') {
      uVar16 = this->_level - 1;
      this->_level = uVar16;
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      uVar17 = (ulong)uVar16;
      String::alloc((String *)local_a0,uVar16);
      pVVar7 = (Var *)(local_a0 + 8);
      pVVar9 = pVVar7;
      if (local_a0._0_4_ != 0) {
        pVVar9 = (Var *)local_a0._8_8_;
      }
      *(undefined1 *)((long)&pVVar9->_type + uVar17) = 0;
      pVVar9 = pVVar7;
      if (local_a0._0_4_ != 0) {
        pVVar9 = (Var *)local_a0._8_8_;
      }
      local_a0._4_4_ = uVar16;
      memset(pVVar9,9,uVar17);
      *(undefined1 *)((long)&pVVar9->_type + uVar17) = 0;
      if (local_a0._0_4_ != 0) {
        pVVar7 = (Var *)local_a0._8_8_;
      }
      String::assign(&this->_indent,(char *)pVVar7,local_a0._4_4_);
      if (local_a0._0_4_ != 0) {
        free((void *)local_a0._8_8_);
      }
      String::operator+=(&this->_out,'\n');
      if ((this->_indent)._size == 0) {
        paVar14 = &(this->_indent).field_2;
      }
      else {
        paVar14 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_indent).field_2._str;
      }
      String::append(&this->_out,paVar14->_space,(this->_indent)._len);
    }
    b = ']';
    goto LAB_0012cf6e;
  case DIC:
    if (this->_json == false) {
      String::String((String *)local_a0,"$type");
      pVVar7 = Var::getp(v,(String *)local_a0);
      if (local_a0._0_4_ != 0) {
        free((void *)local_a0._8_8_);
      }
      if (pVVar7 == (Var *)0x0) {
        _class = "";
      }
      else {
        _class = Var::operator*(pVVar7);
      }
      begin_object(this,_class);
    }
    else {
      begin_object(this,"");
      pVVar7 = (Var *)0x0;
    }
    if (this->_pretty == true) {
      uVar16 = this->_level + 1;
      this->_level = uVar16;
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      uVar17 = (ulong)uVar16;
      String::alloc((String *)local_a0,uVar16);
      pVVar9 = (Var *)(local_a0 + 8);
      pVVar8 = pVVar9;
      if (local_a0._0_4_ != 0) {
        pVVar8 = (Var *)local_a0._8_8_;
      }
      *(undefined1 *)((long)&pVVar8->_type + uVar17) = 0;
      pVVar8 = pVVar9;
      if (local_a0._0_4_ != 0) {
        pVVar8 = (Var *)local_a0._8_8_;
      }
      local_a0._4_4_ = uVar16;
      memset(pVVar8,9,uVar17);
      *(undefined1 *)((long)&pVVar8->_type + uVar17) = 0;
      if (local_a0._0_4_ != 0) {
        pVVar9 = (Var *)local_a0._8_8_;
      }
      String::assign(&this->_indent,(char *)pVVar9,local_a0._4_4_);
      if (local_a0._0_4_ != 0) {
        free((void *)local_a0._8_8_);
      }
    }
    local_80 = 0;
    if (v->_type == DIC) {
      local_a0._16_8_ = &v->field_1;
      local_88 = 0;
    }
    local_78 = (Var *)(local_a0 + 8);
    local_a0._0_4_ = 1;
    local_70 = &(this->_indent).field_2;
    iVar18 = 0;
    local_a0._8_8_ = v;
    while ((iVar4 = local_80, iVar6 = Var::length((Var *)local_a0._8_8_), iVar4 < iVar6 &&
           (local_a0._0_4_ != 0))) {
      if (*(int *)local_a0._8_8_ == 10) {
        pVVar9 = (Var *)(*(long *)local_a0._16_8_ + (long)local_88 * 0x28 + 0x18);
      }
      else {
        pVVar9 = (Var *)local_a0._8_8_;
        if (*(int *)local_a0._8_8_ == 9) {
          pVVar9 = (Var *)((long)local_80 * 0x10 +
                          ((anon_union_8_8_7df20137_for_Var_3 *)(local_a0._8_8_ + 8))->_l);
        }
      }
      uVar16 = local_a0._0_4_;
      if (0 < (int)local_a0._0_4_) {
        do {
          Var::Enumerator::operator~(&local_48,(Enumerator *)(local_a0 + 8));
          for (; local_a0._0_4_ != 0; local_a0._0_4_ = local_a0._0_4_ - 1) {
            if ((pVVar9->_type != NONE) && (pVVar9 != pVVar7 || (this->_json & 1U) != 0)) {
              if (0 < iVar18) {
                paVar14 = &(this->_sep2).field_2;
                if ((this->_sep2)._size != 0) {
                  paVar14 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_sep2).field_2._str;
                }
                String::append(&this->_out,paVar14->_space,(this->_sep2)._len);
              }
              if (this->_pretty == true) {
                String::operator+=(&this->_out,'\n');
                paVar14 = local_70;
                if ((this->_indent)._size != 0) {
                  paVar14 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_indent).field_2._str;
                }
                String::append(&this->_out,paVar14->_space,(this->_indent)._len);
              }
              new_property(this,&local_48);
              _encode(this,pVVar9);
              iVar18 = iVar18 + 1;
            }
          }
          if (local_48._size != 0) {
            free(local_48.field_2._str);
          }
          uVar16 = local_a0._0_4_ - 2;
          bVar3 = 2 < (int)local_a0._0_4_;
          local_a0._0_4_ = uVar16;
        } while (bVar3);
      }
      local_80 = local_80 + 1;
      if (*(int *)local_a0._8_8_ == 10) {
        local_88 = local_88 + 1;
      }
      local_a0._0_4_ = ~uVar16;
    }
    if (this->_pretty != false) {
      uVar16 = this->_level - 1;
      this->_level = uVar16;
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      uVar17 = (ulong)uVar16;
      String::alloc((String *)local_a0,uVar16);
      pVVar7 = (Var *)(local_a0 + 8);
      if (local_a0._0_4_ != 0) {
        pVVar7 = (Var *)local_a0._8_8_;
      }
      *(undefined1 *)((long)&pVVar7->_type + uVar17) = 0;
      pVVar7 = (Var *)(local_a0 + 8);
      if (local_a0._0_4_ != 0) {
        pVVar7 = (Var *)local_a0._8_8_;
      }
      local_a0._4_4_ = uVar16;
      memset(pVVar7,9,uVar17);
      *(undefined1 *)((long)&pVVar7->_type + uVar17) = 0;
      if (local_a0._0_4_ != 0) {
        local_78 = (Var *)local_a0._8_8_;
      }
      String::assign(&this->_indent,(char *)local_78,local_a0._4_4_);
      if (local_a0._0_4_ != 0) {
        free((void *)local_a0._8_8_);
      }
      String::operator+=(&this->_out,'\n');
      if ((this->_indent)._size == 0) {
        paVar14 = &(this->_indent).field_2;
      }
      else {
        paVar14 = (anon_union_16_2_78e7fdac_for_String_2 *)(this->_indent).field_2._str;
      }
      String::append(&this->_out,paVar14->_space,(this->_indent)._len);
    }
    b = '}';
LAB_0012cf6e:
    String::operator+=(&this->_out,b);
  }
  if (16000 < (this->_out)._len) {
    (*this->_sink->_vptr_XdlSink[2])(this->_sink,this);
  }
  return;
}

Assistant:

void XdlEncoder::_encode(const Var& v)
{
	switch(v._type)
	{
	case Var::FLOAT:
		new_number((float)v._d);
		break;
	case Var::NUMBER:
		new_number(v._d);
		break;
	case Var::INT:
		new_number(v._i);
		break;
	case Var::STRING:
		new_string(v._s->data());
		break;
	case Var::SSTRING:
		new_string(v._ss);
		break;
	case Var::BOOL:
		new_bool(v._b);
		break;
	case Var::ARRAY: {
		begin_array();
		int n = v.length();
		const Var& v0 = n>0? v[0] : v;
		bool multi = (_pretty && (n > 10 || (n>0  && (v0.is(Var::ARRAY) || v0.is(Var::OBJ)))));
		if (_pretty && !multi && v0.is(Var::STRING))
		{
			for (int i = 0, m = 0; i < n; i++)
				if ((m += v[i].length()) > 100)
				{
					multi = true;
					break;
				}
		}
		bool big = false;
		if(multi)
		{
			big = n > 0 && (v0.is(Var::ARRAY) || v0.is(Var::DIC) || v0.is(Var::STRING));
			_indent = String::repeat(INDENT_CHAR, ++_level);
			_out << '\n' << _indent;
		}
		for(int i=0; i<v.length(); i++)
		{
			if(i>0) {
				if (multi && (big || (i % 16) == 0))
					_out << _sep2 << '\n' << _indent;
				else
					_out << _sep1;
			}
			_encode(v[i]);
		}
		if(multi) {
			_indent = String::repeat(INDENT_CHAR, --_level);
			_out << '\n' << _indent;
		}
		end_array();
		break;
		}
	case Var::OBJ: {
		const Var* cname = 0;
		if (!_json)
		{
			cname = v.getp(ASL_XDLCLASS);
			begin_object(cname ? **cname : "");
		}
		else
			begin_object("");
		int k = 0;
		if (_pretty)
			_indent = String::repeat(INDENT_CHAR, ++_level);

		foreach2(String& name, Var& value, v)
		{
			if(value.ok() && (_json || &value != cname))
			{
				if (k++ > 0)
					_out << _sep2;
				if (_pretty)
					_out << '\n' << _indent;

				new_property(name);
				_encode(value);
			}
		}
		if(_pretty) {
			_indent = String::repeat(INDENT_CHAR, --_level);
			_out << '\n' << _indent;
		}
		end_object();
		}
		break;
	case Var::NUL:
		_out << "null";
		break;
	case Var::NONE:
		_out << "null";
		break;
	}

	if (_out.length() > 16000)
		_sink->write(_out);
}